

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::Select_
          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *__return_storage_ptr__,AddrManImpl *this,bool new_only,
          unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
          *networks)

{
  FastRandomContext *this_00;
  ulong uVar1;
  __node_base_ptr p_Var2;
  uint uVar3;
  double dVar4;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *ppVar5;
  nid_type (*panVar6) [64];
  bool bVar7;
  uint uVar8;
  Network NVar9;
  __node_base_ptr p_Var10;
  uint64_t uVar11;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *ppVar12;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *ppVar13;
  __node_base_ptr p_Var14;
  time_point tVar15;
  Logger *this_01;
  uint uVar16;
  _Hash_node_base *p_Var17;
  char *pcVar18;
  ulong uVar19;
  int iVar20;
  uint64_t maxval;
  long lVar21;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *ppVar22;
  int bits;
  __node_base_ptr p_Var23;
  bool bVar24;
  __hash_code __code;
  _Hash_node_base *p_Var25;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *ppVar26;
  uint uVar27;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *ppVar28;
  long in_FS_OFFSET;
  double dVar29;
  undefined1 auVar30 [16];
  string_view logging_function;
  string_view source_file;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *__range2;
  char *local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((networks->_M_h)._M_element_count == 0) {
      lVar21 = (long)this->nNew;
      ppVar26 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                 *)(long)this->nTried;
    }
    else {
      p_Var25 = (networks->_M_h)._M_before_begin._M_nxt;
      if (p_Var25 == (_Hash_node_base *)0x0) {
        ppVar26 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)0x0;
        lVar21 = 0;
      }
      else {
        lVar21 = 0;
        ppVar26 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)0x0;
        do {
          p_Var10 = std::
                    _Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::_M_find_before_node
                              (&(this->m_network_counts)._M_h,
                               (ulong)*(uint *)&p_Var25[1]._M_nxt %
                               (this->m_network_counts)._M_h._M_bucket_count,
                               (key_type *)(p_Var25 + 1),(ulong)*(uint *)&p_Var25[1]._M_nxt);
          p_Var17 = (_Hash_node_base *)0x0;
          if (p_Var10 != (__node_base_ptr)0x0) {
            p_Var17 = p_Var10->_M_nxt;
          }
          if (p_Var17 != (_Hash_node_base *)0x0) {
            lVar21 = (long)&(p_Var17[2]._M_nxt)->_M_nxt + lVar21;
            ppVar26 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                       *)((long)&(p_Var17[3]._M_nxt)->_M_nxt + (long)&ppVar26->first);
          }
          p_Var25 = p_Var25->_M_nxt;
        } while (p_Var25 != (_Hash_node_base *)0x0);
      }
    }
    if ((!new_only || lVar21 != 0) && (lVar21 != -(long)ppVar26)) {
      bVar24 = !new_only &&
               ppVar26 !=
               (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                *)0x0;
      if ((!new_only &&
           ppVar26 !=
           (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)0x0) && (lVar21 != 0)) {
        uVar11 = RandomMixin<FastRandomContext>::randbits<1>
                           (&(this->insecure_rand).super_RandomMixin<FastRandomContext>);
        bVar24 = uVar11 != 0;
      }
      this_00 = &this->insecure_rand;
      ppVar22 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                 *)0x3ff;
      if (bVar24) {
        ppVar22 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)0xff;
      }
      pcVar18 = "new";
      if (bVar24) {
        pcVar18 = "tried";
      }
      uVar3 = 0x1f;
      if ((uint)ppVar22 != 0) {
        for (; (uint)ppVar22 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      dVar4 = 1.0;
      ppVar28 = __return_storage_ptr__;
      do {
        do {
          ppVar12 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)RandomMixin<FastRandomContext>::randbits
                                 (&this_00->super_RandomMixin<FastRandomContext>,
                                  (uVar3 ^ 0xffffffe0) + 0x21);
          ppVar5 = ppVar28;
          if (ppVar12 <= ppVar22) {
            ppVar5 = ppVar12;
          }
          ppVar28 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)((ulong)ppVar5 & 0xffffffff);
        } while (ppVar22 < ppVar12);
        do {
          ppVar13 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)RandomMixin<FastRandomContext>::randbits
                                 (&this_00->super_RandomMixin<FastRandomContext>,6);
          ppVar12 = ppVar26;
          if ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
               *)0x3f >= ppVar13) {
            ppVar12 = ppVar13;
          }
          ppVar26 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)((ulong)ppVar12 & 0xffffffff);
        } while ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                  *)0x3f < ppVar13);
        uVar27 = (uint)ppVar5;
        iVar20 = 0;
        do {
          uVar16 = iVar20 + (int)ppVar12;
          uVar8 = iVar20 + 0x3f + (int)ppVar12;
          if (-1 < (int)uVar16) {
            uVar8 = uVar16;
          }
          uVar16 = uVar16 - (uVar8 & 0xffffffc0);
          p_Var25 = (_Hash_node_base *)0xffffffffffffffff;
          if (bVar24) {
            panVar6 = this->vvTried;
            if (uVar27 < 0x100) {
joined_r0x004429d7:
              if (uVar16 < 0x40) {
                p_Var25 = (_Hash_node_base *)panVar6[(int)uVar27][(int)uVar16];
              }
            }
          }
          else {
            panVar6 = this->vvNew;
            if (uVar27 < 0x400) goto joined_r0x004429d7;
          }
          if (p_Var25 != (_Hash_node_base *)0xffffffffffffffff) {
            if ((networks->_M_h)._M_element_count == 0) goto LAB_00442b05;
            uVar1 = (this->mapInfo)._M_h._M_bucket_count;
            uVar19 = (ulong)p_Var25 % uVar1;
            p_Var2 = (this->mapInfo)._M_h._M_buckets[uVar19];
            p_Var14 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var14 = p_Var2, p_Var23 = p_Var2->_M_nxt, p_Var25 != p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var17 = p_Var23->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
                p_Var14 = (__node_base_ptr)0x0;
                if (((ulong)p_Var17[1]._M_nxt % uVar1 != uVar19) ||
                   (p_Var14 = p_Var23, p_Var23 = p_Var17, p_Var25 == p_Var17[1]._M_nxt))
                goto LAB_00442a67;
              }
              p_Var14 = (__node_base_ptr)0x0;
            }
LAB_00442a67:
            if (p_Var14 == (__node_base_ptr)0x0) {
              p_Var17 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var17 = p_Var14->_M_nxt;
            }
            if (p_Var17 != (_Hash_node_base *)0x0) {
              NVar9 = CNetAddr::GetNetwork((CNetAddr *)(p_Var17 + 2));
              uVar1 = (networks->_M_h)._M_bucket_count;
              uVar19 = (ulong)NVar9 % uVar1;
              p_Var2 = (networks->_M_h)._M_buckets[uVar19];
              p_Var14 = (__node_base_ptr)0x0;
              if ((p_Var2 != (__node_base_ptr)0x0) &&
                 (p_Var14 = p_Var2, p_Var23 = p_Var2->_M_nxt,
                 NVar9 != *(Network *)&p_Var2->_M_nxt[1]._M_nxt)) {
                while (p_Var17 = p_Var23->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
                  p_Var14 = (__node_base_ptr)0x0;
                  if (((ulong)*(Network *)&p_Var17[1]._M_nxt % uVar1 != uVar19) ||
                     (p_Var14 = p_Var23, p_Var23 = p_Var17, NVar9 == *(Network *)&p_Var17[1]._M_nxt)
                     ) goto LAB_00442adf;
                }
                p_Var14 = (__node_base_ptr)0x0;
              }
LAB_00442adf:
              if ((p_Var14 != (__node_base_ptr)0x0) && (p_Var14->_M_nxt != (_Hash_node_base *)0x0))
              goto LAB_00442b05;
            }
          }
          iVar20 = iVar20 + 1;
        } while (iVar20 != 0x40);
        iVar20 = 0x40;
LAB_00442b05:
        if (iVar20 == 0x40) {
LAB_00442d2b:
          bVar7 = false;
        }
        else {
          uVar1 = (this->mapInfo)._M_h._M_bucket_count;
          uVar19 = (ulong)p_Var25 % uVar1;
          p_Var2 = (this->mapInfo)._M_h._M_buckets[uVar19];
          p_Var14 = (__node_base_ptr)0x0;
          if ((p_Var2 != (__node_base_ptr)0x0) &&
             (p_Var14 = p_Var2, p_Var23 = p_Var2->_M_nxt, p_Var25 != p_Var2->_M_nxt[1]._M_nxt)) {
            while (p_Var17 = p_Var23->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
              p_Var14 = (__node_base_ptr)0x0;
              if (((ulong)p_Var17[1]._M_nxt % uVar1 != uVar19) ||
                 (p_Var14 = p_Var23, p_Var23 = p_Var17, p_Var25 == p_Var17[1]._M_nxt))
              goto LAB_00442b78;
            }
            p_Var14 = (__node_base_ptr)0x0;
          }
LAB_00442b78:
          if (p_Var14 == (__node_base_ptr)0x0) {
            p_Var25 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var25 = p_Var14->_M_nxt;
          }
          if (p_Var25 == (_Hash_node_base *)0x0) {
            __assert_fail("it_found != mapInfo.end()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                          ,0x30d,
                          "std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool, const std::unordered_set<Network> &) const"
                         );
          }
          uVar11 = RandomMixin<FastRandomContext>::randbits<30>
                             (&this_00->super_RandomMixin<FastRandomContext>);
          auVar30._8_4_ = (int)(uVar11 >> 0x20);
          auVar30._0_8_ = uVar11;
          auVar30._12_4_ = 0x45300000;
          tVar15 = NodeClock::now();
          ppVar26 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)(ulong)((long)tVar15.__d.__r / 1000000000 - (long)p_Var25[9]._M_nxt < 600);
          iVar20 = *(int *)&p_Var25[0x10]._M_nxt;
          if (7 < iVar20) {
            iVar20 = 8;
          }
          dVar29 = pow(0.66,(double)iVar20);
          if (dVar29 * *(double *)(&DAT_00828a90 + (long)ppVar26 * 8) * dVar4 * 1073741824.0 <=
              (auVar30._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) {
            dVar4 = dVar4 * 1.2;
            goto LAB_00442d2b;
          }
          this_01 = LogInstance();
          bVar7 = BCLog::Logger::WillLogCategoryLevel(this_01,ADDRMAN,Debug);
          if (bVar7) {
            CService::ToStringAddrPort_abi_cxx11_(&local_58,(CService *)(p_Var25 + 2));
            logging_function._M_str = "Select_";
            logging_function._M_len = 7;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
            ;
            source_file._M_len = 0x5b;
            local_60 = pcVar18;
            LogPrintFormatInternal<std::__cxx11::string,char_const*>
                      (logging_function,source_file,0x312,ADDRMAN,Debug,
                       (ConstevalFormatString<2U>)0x828ed0,&local_58,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
          prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__,
                     (prevector<16U,_unsigned_char,_unsigned_int,_int> *)(p_Var25 + 2));
          *(_Hash_node_base **)&(__return_storage_ptr__->first).super_CService.super_CNetAddr.m_net
               = p_Var25[5]._M_nxt;
          (__return_storage_ptr__->first).super_CService.port = *(uint16_t *)&p_Var25[6]._M_nxt;
          p_Var17 = p_Var25[8]._M_nxt;
          (__return_storage_ptr__->first).nTime.__d.__r = (rep)p_Var25[7]._M_nxt;
          (__return_storage_ptr__->first).nServices = (ServiceFlags)p_Var17;
          (__return_storage_ptr__->second).__d.__r = (rep)p_Var25[9]._M_nxt;
          bVar7 = true;
          ppVar26 = __return_storage_ptr__;
        }
      } while (!bVar7);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_00442e03;
    }
  }
  CService::CService((CService *)__return_storage_ptr__);
  (__return_storage_ptr__->first).nTime.__d.__r = 100000000;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->first).nServices = NODE_NONE;
    (__return_storage_ptr__->second).__d.__r = 0;
    return __return_storage_ptr__;
  }
LAB_00442e03:
  __stack_chk_fail();
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool new_only, const std::unordered_set<Network>& networks) const
{
    AssertLockHeld(cs);

    if (vRandom.empty()) return {};

    size_t new_count = nNew;
    size_t tried_count = nTried;

    if (!networks.empty()) {
        new_count = 0;
        tried_count = 0;
        for (auto& network : networks) {
            auto it = m_network_counts.find(network);
            if (it == m_network_counts.end()) {
                continue;
            }
            auto counts = it->second;
            new_count += counts.n_new;
            tried_count += counts.n_tried;
        }
    }

    if (new_only && new_count == 0) return {};
    if (new_count + tried_count == 0) return {};

    // Decide if we are going to search the new or tried table
    // If either option is viable, use a 50% chance to choose
    bool search_tried;
    if (new_only || tried_count == 0) {
        search_tried = false;
    } else if (new_count == 0) {
        search_tried = true;
    } else {
        search_tried = insecure_rand.randbool();
    }

    const int bucket_count{search_tried ? ADDRMAN_TRIED_BUCKET_COUNT : ADDRMAN_NEW_BUCKET_COUNT};

    // Loop through the addrman table until we find an appropriate entry
    double chance_factor = 1.0;
    while (1) {
        // Pick a bucket, and an initial position in that bucket.
        int bucket = insecure_rand.randrange(bucket_count);
        int initial_position = insecure_rand.randrange(ADDRMAN_BUCKET_SIZE);

        // Iterate over the positions of that bucket, starting at the initial one,
        // and looping around.
        int i, position;
        nid_type node_id;
        for (i = 0; i < ADDRMAN_BUCKET_SIZE; ++i) {
            position = (initial_position + i) % ADDRMAN_BUCKET_SIZE;
            node_id = GetEntry(search_tried, bucket, position);
            if (node_id != -1) {
                if (!networks.empty()) {
                    const auto it{mapInfo.find(node_id)};
                    if (Assume(it != mapInfo.end()) && networks.contains(it->second.GetNetwork())) break;
                } else {
                    break;
                }
            }
        }

        // If the bucket is entirely empty, start over with a (likely) different one.
        if (i == ADDRMAN_BUCKET_SIZE) continue;

        // Find the entry to return.
        const auto it_found{mapInfo.find(node_id)};
        assert(it_found != mapInfo.end());
        const AddrInfo& info{it_found->second};

        // With probability GetChance() * chance_factor, return the entry.
        if (insecure_rand.randbits<30>() < chance_factor * info.GetChance() * (1 << 30)) {
            LogDebug(BCLog::ADDRMAN, "Selected %s from %s\n", info.ToStringAddrPort(), search_tried ? "tried" : "new");
            return {info, info.m_last_try};
        }

        // Otherwise start over with a (likely) different bucket, and increased chance factor.
        chance_factor *= 1.2;
    }
}